

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionProxy::FunctionProxy
          (FunctionProxy *this,ScriptContext *scriptContext,Utf8SourceInfo *utf8SourceInfo,
          uint functionNumber)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014ef888;
  (this->auxPtrs).ptr = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0;
  (this->functionInfo).ptr = (FunctionInfo *)0x0;
  this->m_scriptContext = scriptContext;
  Memory::Recycler::WBSetBit((char *)&this->m_utf8SourceInfo);
  (this->m_utf8SourceInfo).ptr = utf8SourceInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_utf8SourceInfo);
  (this->deferredPrototypeType).ptr = (ScriptFunctionType *)0x0;
  (this->undeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  (this->m_defaultEntryPointInfo).ptr = (ProxyEntryPointInfo *)0x0;
  this->m_functionNumber = functionNumber;
  this->field_0x44 = (this->field_0x44 & 0xd0) + 1;
  return;
}

Assistant:

FunctionProxy::FunctionProxy(ScriptContext* scriptContext, Utf8SourceInfo* utf8SourceInfo, uint functionNumber):
        m_isTopLevel(false),
        m_isPublicLibraryCode(false),
        m_scriptContext(scriptContext),
        deferredPrototypeType(nullptr),
        undeferredFunctionType(nullptr),
        m_utf8SourceInfo(utf8SourceInfo),
        m_functionNumber(functionNumber),
        m_defaultEntryPointInfo(nullptr),
        m_displayNameIsRecyclerAllocated(false),
        m_tag11(true),
        m_isJsBuiltInCode(false)
    {
        PERF_COUNTER_INC(Code, TotalFunction);
    }